

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  long lVar1;
  undefined8 *puVar2;
  ulong in_RAX;
  long *pointer;
  long *plVar3;
  char *this_00;
  Nested *ptrCopy;
  bool destroyed2;
  bool destroyed1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffff;
  pointer = (long *)operator_new(0x18);
  *pointer = (long)&uStack_28 + 7;
  pointer[1] = 0;
  pointer[2] = 0;
  plVar3 = (long *)operator_new(0x18);
  *plVar3 = (long)&uStack_28 + 6;
  plVar3[1] = 0;
  plVar3[2] = 0;
  this_00 = (char *)pointer[1];
  lVar1 = pointer[2];
  pointer[1] = (long)&_::HeapDisposer<kj::(anonymous_namespace)::Nested>::instance;
  pointer[2] = (long)plVar3;
  if (lVar1 != 0) {
    (**(((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00)->super_Disposer)._vptr_Disposer
    )();
  }
  if (((uStack_28._7_1_ != '\0') || (uStack_28._6_1_ == '\x01')) && (_::Debug::minSeverity < 3)) {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
    ;
    _::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3c,ERROR,"\"failed: expected \" \"!(destroyed1 || destroyed2)\"",
               (char (*) [45])"failed: expected !(destroyed1 || destroyed2)");
  }
  puVar2 = (undefined8 *)pointer[1];
  lVar1 = pointer[2];
  pointer[2] = 0;
  _::HeapDisposer<kj::(anonymous_namespace)::Nested>::disposeImpl
            ((HeapDisposer<kj::(anonymous_namespace)::Nested> *)this_00,pointer);
  if ((uStack_28._7_1_ == '\0') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3e,ERROR,"\"failed: expected \" \"destroyed1\"",
               (char (*) [28])"failed: expected destroyed1");
  }
  if ((uStack_28._6_1_ == '\x01') && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x3f,ERROR,"\"failed: expected \" \"!(destroyed2)\"",
               (char (*) [31])"failed: expected !(destroyed2)");
  }
  if (lVar1 != 0) {
    (**(code **)*puVar2)(puVar2,lVar1);
  }
  if (((uStack_28._7_1_ != '\x01') || (uStack_28._6_1_ == '\0')) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/memory-test.c++"
               ,0x41,ERROR,"\"failed: expected \" \"destroyed1 && destroyed2\"",
               (char (*) [42])"failed: expected destroyed1 && destroyed2");
  }
  return;
}

Assistant:

TEST(Memory, AssignNested) {
  bool destroyed1 = false, destroyed2 = false;
  auto nested = heap<Nested>(destroyed1);
  nested->nested = heap<Nested>(destroyed2);
  EXPECT_FALSE(destroyed1 || destroyed2);
  nested = kj::mv(nested->nested);
  EXPECT_TRUE(destroyed1);
  EXPECT_FALSE(destroyed2);
  nested = nullptr;
  EXPECT_TRUE(destroyed1 && destroyed2);
}